

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

bool __thiscall Tokenizer::tryToGetSingleCharToken(Tokenizer *this)

{
  Mark MVar1;
  char cVar2;
  bool bVar3;
  Mark *pMVar4;
  string *this_00;
  allocator<char> local_191;
  Token local_190;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [32];
  
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  cVar2 = Stream::peek(&this->stream_);
  bVar3 = false;
  local_190.mark = MVar1;
  switch(cVar2) {
  case '%':
    std::__cxx11::string::string<std::allocator<char>>(local_138,"%",&local_191);
    local_190.type = Modulo;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_138);
    Token::operator=(&this->token_,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_190.value);
    this_00 = local_138;
    break;
  case '&':
  case '\'':
  case '*':
  case '+':
    goto switchD_0012e4b4_caseD_26;
  case '(':
    std::__cxx11::string::string<std::allocator<char>>(local_b8,"(",&local_191);
    local_190.type = LParen;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_b8);
    Token::operator=(&this->token_,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_190.value);
    this_00 = local_b8;
    break;
  case ')':
    std::__cxx11::string::string<std::allocator<char>>(local_d8,")",&local_191);
    local_190.type = RParen;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_d8);
    Token::operator=(&this->token_,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_190.value);
    this_00 = local_d8;
    break;
  case ',':
    std::__cxx11::string::string<std::allocator<char>>(local_38,",",&local_191);
    local_190.type = Comma;
    std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
    _Variant_storage<0ul,std::__cxx11::string&>
              ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_38);
    Token::operator=(&this->token_,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
    ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         *)&local_190.value);
    this_00 = local_38;
    break;
  default:
    if (cVar2 == ':') {
      std::__cxx11::string::string<std::allocator<char>>(local_58,":",&local_191);
      local_190.type = Colon;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_58);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_58;
    }
    else if (cVar2 == ';') {
      std::__cxx11::string::string<std::allocator<char>>(local_78,";",&local_191);
      local_190.type = Semicolon;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_78);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_78;
    }
    else if (cVar2 == '\\') {
      std::__cxx11::string::string<std::allocator<char>>(local_98,"\\",&local_191);
      local_190.type = Backslash;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_98);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_98;
    }
    else if (cVar2 == '{') {
      std::__cxx11::string::string<std::allocator<char>>(local_f8,"{",&local_191);
      local_190.type = LBrace;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_f8);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_f8;
    }
    else if (cVar2 == '}') {
      std::__cxx11::string::string<std::allocator<char>>(local_118,"}",&local_191);
      local_190.type = RBrace;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_118);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_118;
    }
    else {
      if (cVar2 != '~') {
        return false;
      }
      std::__cxx11::string::string<std::allocator<char>>(local_158,"~",&local_191);
      local_190.type = BinaryNot;
      std::__detail::__variant::_Variant_storage<false,std::__cxx11::string,double>::
      _Variant_storage<0ul,std::__cxx11::string&>
                ((_Variant_storage<false,std::__cxx11::string,double> *)&local_190.value,local_158);
      Token::operator=(&this->token_,&local_190);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_190.value);
      this_00 = local_158;
    }
  }
  std::__cxx11::string::~string(this_00);
  Stream::advance(&this->stream_);
  bVar3 = true;
switchD_0012e4b4_caseD_26:
  return bVar3;
}

Assistant:

bool Tokenizer::tryToGetSingleCharToken()
{
  const Mark mark = stream_.getMark();
  switch(stream_.peek())
  {
    case ',':
      token_ = Token{TokenType::Comma, ",", mark};
      break;
    case ':':
      token_ = Token{TokenType::Colon, ":", mark};
      break;
    case ';':
      token_ = Token{TokenType::Semicolon, ";", mark};
      break;
    case '\\':
      token_ = Token{TokenType::Backslash, "\\", mark};
      break;
    case '(':
      token_ = Token{TokenType::LParen, "(", mark};
      break;
    case ')':
      token_ = Token{TokenType::RParen, ")", mark};
      break;
    case '{':
      token_ = Token{TokenType::LBrace, "{", mark};
      break;
    case '}':
      token_ = Token{TokenType::RBrace, "}", mark};
      break;
    case '%':
      token_ = Token{TokenType::Modulo, "%", mark};
      break;
    case '~':
      token_ = Token{TokenType::BinaryNot, "~", mark};
      break;
    default:
      return false;
  }
  stream_.advance();
  return true;
}